

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O1

int coda_expression_eval_void(coda_expression *expr,coda_cursor *cursor)

{
  int iVar1;
  char *message;
  eval_info info;
  eval_info local_348;
  
  if (expr->result_type == coda_expression_void) {
    local_348.orig_cursor = cursor;
    if (cursor == (coda_cursor *)0x0) {
      if (expr->is_constant == 0) {
        message = "cursor argument may not be NULL if expression is not constant";
        goto LAB_0010db93;
      }
    }
    else {
      memcpy(&local_348.cursor,cursor,0x310);
    }
    local_348.index[2] = 0;
    local_348.variable_index = 0;
    local_348.index[0] = 0;
    local_348.index[1] = 0;
    local_348.variable_name = (char *)0x0;
    iVar1 = eval_void(&local_348,expr);
  }
  else {
    message = "expression is not a \'void\' expression";
LAB_0010db93:
    coda_set_error(-100,message);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int coda_expression_eval_void(const coda_expression *expr, const coda_cursor *cursor)
{
    eval_info info;

    if (expr->result_type != coda_expression_void)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not a 'void' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    return eval_void(&info, expr);
}